

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

bool __thiscall ON_wString::StartsWith(ON_wString *this,wchar_t *wszSub)

{
  size_t sVar1;
  ON_wStringHeader *pOVar2;
  int local_2c;
  int i;
  size_t lenSub;
  wchar_t *wszSub_local;
  ON_wString *this_local;
  
  sVar1 = wcslen(wszSub);
  if (sVar1 == 0) {
    this_local._7_1_ = false;
  }
  else {
    pOVar2 = Header(this);
    if ((ulong)(long)pOVar2->string_length < sVar1) {
      this_local._7_1_ = false;
    }
    else {
      for (local_2c = 0; (ulong)(long)local_2c < sVar1; local_2c = local_2c + 1) {
        if (this->m_s[local_2c] != wszSub[local_2c]) {
          return false;
        }
      }
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool ON_wString::StartsWith(const wchar_t* wszSub) const
{
  const auto lenSub = wcslen(wszSub);
  if (0 == lenSub)
    return false;

  if (lenSub > Header()->string_length)
    return false;

  for (int i = 0; i < lenSub; i++)
  {
    if (m_s[i] != wszSub[i])
      return false;
  }

  return true;
}